

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::EglConfig::~EglConfig(EglConfig *this)

{
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__EglConfig_00120b70;
  std::__cxx11::string::~string((string *)&this->transparentType);
  std::__cxx11::string::~string((string *)&this->surfaceTypes);
  std::__cxx11::string::~string((string *)&this->renderableType);
  std::__cxx11::string::~string((string *)&this->conformant);
  std::__cxx11::string::~string((string *)&this->configCaveat);
  std::__cxx11::string::~string((string *)&this->colorBufferType);
  return;
}

Assistant:

~EglConfig			(void) {}